

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_disp_type_list(int which)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar2 = "ALL";
  if (which == 2) {
    pcVar2 = "NIFTI_TYPE_";
  }
  pcVar3 = "DT_";
  if (which != 1) {
    pcVar3 = pcVar2;
  }
  printf("nifti_type_list entries (%s) :\n  name                    type    nbyper    swapsize\n  ---------------------   ----    ------    --------\n"
         ,pcVar3);
  lVar4 = 0x10;
  do {
    if (lVar4 == 0x418) {
      return 0;
    }
    pcVar2 = *(char **)((long)&nifti_type_list[0].type + lVar4);
    cVar1 = *pcVar2;
    if (which == 2) {
      if (cVar1 == 'N') {
LAB_0011921b:
        printf("  %-22s %5d     %3d      %5d\n",pcVar2,
               (ulong)*(uint *)((long)&__frame_dummy_init_array_entry + lVar4),
               (ulong)*(uint *)((long)&__frame_dummy_init_array_entry + lVar4 + 4),
               (ulong)*(uint *)((long)&__do_global_dtors_aux_fini_array_entry + lVar4));
      }
    }
    else if ((cVar1 == 'D') || (which != 1 && cVar1 == 'N')) goto LAB_0011921b;
    lVar4 = lVar4 + 0x18;
  } while( true );
}

Assistant:

int nifti_disp_type_list( int which )
{
    const char * style;
    int    tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int    lwhich, c;

    if     ( which == 1 ){ lwhich = 1; style = "DT_"; }
    else if( which == 2 ){ lwhich = 2; style = "NIFTI_TYPE_"; }
    else                 { lwhich = 3; style = "ALL"; }

    printf("nifti_type_list entries (%s) :\n"
           "  name                    type    nbyper    swapsize\n"
           "  ---------------------   ----    ------    --------\n", style);

    for( c = 0; c < tablen; c++ )
        if( (lwhich & 1 && nifti_type_list[c].name[0] == 'D')  ||
            (lwhich & 2 && nifti_type_list[c].name[0] == 'N')     )
            printf("  %-22s %5d     %3d      %5d\n",
                   nifti_type_list[c].name,
                   nifti_type_list[c].type,
                   nifti_type_list[c].nbyper,
                   nifti_type_list[c].swapsize);

    return 0;
}